

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::NotImplementedException::~NotImplementedException(NotImplementedException *this)

{
  ~NotImplementedException(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~NotImplementedException() CATCH_NOEXCEPT {}